

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpyramid.cpp
# Opt level: O1

void pztopology::TPZPyramid::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *pFVar1;
  value_type vVar2;
  value_type vVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar8;
  Fad<double> *pFVar9;
  undefined4 uVar10;
  double dVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int i_4;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  MEM_CPY<double> *pMVar18;
  long lVar19;
  TPZFMatrix<Fad<double>_> *pTVar20;
  MEM_CPY<double> *pMVar21;
  int sz_2;
  uint uVar22;
  int sz_3;
  int i;
  ulong uVar23;
  Fad<double> lmez;
  Fad<double> lmexmez;
  Fad<double> lmeymez;
  int sz_1;
  Fad<double> zeta;
  Fad<double> T1yz;
  int sz;
  Fad<double> lmaxmez;
  Fad<double> xi;
  Fad<double> T1xz;
  Fad<double> lmaymez;
  Fad<double> eta;
  Fad<double> T0yz;
  Fad<double> T0xz;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  local_340;
  undefined1 local_330 [8];
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *local_328;
  EVP_PKEY_CTX *pEStack_320;
  Fad<double> *local_318;
  undefined1 local_310 [8];
  Fad<double> *local_308;
  EVP_PKEY_CTX *pEStack_300;
  Fad<double> *local_2f8;
  undefined1 local_2f0 [8];
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *local_2e8;
  EVP_PKEY_CTX *pEStack_2e0;
  Fad<double> *local_2d8;
  uint local_2cc;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_2c8;
  undefined1 local_2a8 [24];
  double local_290;
  undefined1 local_288 [8];
  double local_280;
  double *pdStack_278;
  Fad<double> *local_270;
  double local_268;
  undefined8 uStack_260;
  undefined1 local_258 [8];
  Vector<double> local_250;
  double local_240;
  undefined1 local_238 [24];
  double local_220;
  undefined1 local_218 [8];
  double local_210;
  double *pdStack_208;
  Fad<double> *local_200;
  undefined1 local_1f8 [8];
  Vector<double> local_1f0;
  double local_1e0;
  undefined1 local_1d8 [24];
  double local_1c0;
  undefined1 local_1b8 [8];
  double local_1b0;
  double *pdStack_1a8;
  Fad<double> *local_1a0;
  Fad<double> local_198;
  undefined8 *local_178;
  Fad<double> *local_170;
  undefined8 **local_168;
  Fad<double> *local_160;
  Fad<double> *local_158;
  undefined8 *local_150;
  undefined1 local_148 [16];
  TPZFMatrix<Fad<double>_> *local_138;
  Fad<double> local_130;
  Fad<double> local_110;
  Fad<double> local_f0;
  Fad<double> local_d0;
  Fad<double> local_b0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> local_50;
  
  pFVar1 = loc->fStore;
  local_238._0_8_ = pFVar1->val_;
  uVar22 = (pFVar1->dx_).num_elts;
  local_238._16_8_ = (MEM_CPY<double> *)0x0;
  local_238._8_4_ = uVar22;
  local_138 = dphi;
  if ((long)(int)uVar22 != 0) {
    uVar23 = 0xffffffffffffffff;
    if (-1 < (int)uVar22) {
      uVar23 = (long)(int)uVar22 << 3;
    }
    local_238._16_8_ = operator_new__(uVar23);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_238._16_8_,(EVP_PKEY_CTX *)(pFVar1->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar22);
  }
  local_220 = pFVar1->defaultVal;
  pFVar1 = loc->fStore;
  local_1d8._0_8_ = pFVar1[1].val_;
  uVar22 = pFVar1[1].dx_.num_elts;
  local_1d8._16_8_ = (MEM_CPY<double> *)0x0;
  local_1d8._8_4_ = uVar22;
  if ((long)(int)uVar22 != 0) {
    uVar23 = 0xffffffffffffffff;
    if (-1 < (int)uVar22) {
      uVar23 = (long)(int)uVar22 * 8;
    }
    local_1d8._16_8_ = operator_new__(uVar23);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_1d8._16_8_,(EVP_PKEY_CTX *)pFVar1[1].dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar22);
  }
  local_1c0 = pFVar1[1].defaultVal;
  pFVar1 = loc->fStore;
  local_2a8._0_8_ = pFVar1[2].val_;
  uVar22 = pFVar1[2].dx_.num_elts;
  local_2a8._16_8_ = (MEM_CPY<double> *)0x0;
  local_2a8._8_4_ = uVar22;
  if ((long)(int)uVar22 != 0) {
    uVar23 = 0xffffffffffffffff;
    if (-1 < (int)uVar22) {
      uVar23 = (long)(int)uVar22 * 8;
    }
    local_2a8._16_8_ = operator_new__(uVar23);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_2a8._16_8_,(EVP_PKEY_CTX *)pFVar1[2].dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar22);
  }
  local_290 = pFVar1[2].defaultVal;
  if (1.0 < (double)local_2a8._0_8_) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpyramid.cpp"
               ,0x11e);
  }
  local_310 = (undefined1  [8])local_218;
  local_210 = 1.0;
  pdStack_208 = (double *)0x0;
  local_1a0 = (Fad<double> *)local_310;
  local_308 = (Fad<double> *)local_238;
  local_330 = (undefined1  [8])local_1b8;
  local_1b0 = 0.5;
  pdStack_1a8 = (double *)0x0;
  local_328 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_288;
  local_280 = 1.0;
  pdStack_278 = (double *)0x0;
  local_198.val_ =
       (((1.0 - (double)local_2a8._0_8_) - (double)local_238._0_8_) * 0.5) /
       (1.0 - (double)local_2a8._0_8_);
  uVar22 = local_238._8_4_;
  if ((int)local_238._8_4_ < (int)local_2a8._8_4_) {
    uVar22 = local_2a8._8_4_;
  }
  local_198.dx_.num_elts = 0;
  local_198.dx_.ptr_to_data = (double *)0x0;
  if ((int)uVar22 < 1) {
    local_198.defaultVal = 0.0;
  }
  else {
    local_270 = (Fad<double> *)local_2a8;
    local_200 = (Fad<double> *)local_2a8;
    local_198.dx_.num_elts = uVar22;
    local_198.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar22 * 8);
    local_198.defaultVal = 0.0;
    if (0 < (int)uVar22) {
      uVar23 = 0;
      do {
        vVar2 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                      *)local_330,(int)uVar23);
        local_198.dx_.ptr_to_data[uVar23] = vVar2;
        uVar23 = uVar23 + 1;
      } while (uVar22 != uVar23);
    }
  }
  dVar11 = local_1b0;
  local_280 = 1.0;
  pdStack_278 = (double *)0x0;
  local_200 = (Fad<double> *)local_2f0;
  local_2f0 = (undefined1  [8])local_288;
  local_210 = 0.5;
  pdStack_208 = (double *)0x0;
  local_308 = (Fad<double> *)local_330;
  local_328 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  pEStack_320 = (EVP_PKEY_CTX *)0x0;
  local_310 = (undefined1  [8])local_218;
  local_1b8 = (undefined1  [8])
              ((((1.0 - (double)local_2a8._0_8_) - (double)local_1d8._0_8_) * 0.5) /
              (1.0 - (double)local_2a8._0_8_));
  uVar22 = local_1d8._8_4_;
  if ((int)local_1d8._8_4_ < (int)local_2a8._8_4_) {
    uVar22 = local_2a8._8_4_;
  }
  local_1b0 = (double)((ulong)local_1b0 & 0xffffffff00000000);
  pdStack_1a8 = (double *)0x0;
  if ((int)uVar22 < 1) {
    local_1a0 = (Fad<double> *)0x0;
  }
  else {
    local_1b0 = (double)CONCAT44(SUB84(dVar11,4),uVar22);
    local_318 = (Fad<double> *)local_2a8;
    local_2e8 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_1d8;
    local_270 = (Fad<double> *)local_2a8;
    pdStack_1a8 = (double *)operator_new__((ulong)uVar22 * 8);
    local_1a0 = (Fad<double> *)0x0;
    if (0 < (int)uVar22) {
      uVar23 = 0;
      do {
        vVar2 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                      *)local_310,(int)uVar23);
        pdStack_1a8[uVar23] = vVar2;
        uVar23 = uVar23 + 1;
      } while (uVar22 != uVar23);
    }
  }
  dVar11 = local_210;
  local_328 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  pEStack_320 = (EVP_PKEY_CTX *)0x0;
  local_270 = (Fad<double> *)local_258;
  local_258 = (undefined1  [8])local_330;
  local_250._0_8_ = local_238;
  local_280 = 0.5;
  pdStack_278 = (double *)0x0;
  local_308 = (Fad<double> *)0x3ff0000000000000;
  pEStack_300 = (EVP_PKEY_CTX *)0x0;
  local_2f0 = (undefined1  [8])local_288;
  local_2e8 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_310;
  local_218 = (undefined1  [8])
              ((((double)local_238._0_8_ + (1.0 - (double)local_2a8._0_8_)) * 0.5) /
              (1.0 - (double)local_2a8._0_8_));
  uVar22 = local_238._8_4_;
  if ((int)local_238._8_4_ < (int)local_2a8._8_4_) {
    uVar22 = local_2a8._8_4_;
  }
  local_210 = (double)((ulong)local_210 & 0xffffffff00000000);
  pdStack_208 = (double *)0x0;
  if ((int)uVar22 < 1) {
    local_200 = (Fad<double> *)0x0;
  }
  else {
    local_210 = (double)CONCAT44(SUB84(dVar11,4),uVar22);
    local_318 = (Fad<double> *)local_2a8;
    local_2f8 = (Fad<double> *)local_2a8;
    pdStack_208 = (double *)operator_new__((ulong)uVar22 * 8);
    local_200 = (Fad<double> *)0x0;
    if (0 < (int)uVar22) {
      uVar23 = 0;
      do {
        vVar3 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                      *)local_2f0,(int)uVar23);
        pdStack_208[uVar23] = vVar3;
        uVar23 = uVar23 + 1;
      } while (uVar22 != uVar23);
    }
  }
  dVar11 = local_280;
  local_308 = (Fad<double> *)0x3ff0000000000000;
  pEStack_300 = (EVP_PKEY_CTX *)0x0;
  local_318 = (Fad<double> *)local_1f8;
  local_1f8 = (undefined1  [8])local_310;
  local_328 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)0x3fe0000000000000;
  pEStack_320 = (EVP_PKEY_CTX *)0x0;
  local_2e8 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  pEStack_2e0 = (EVP_PKEY_CTX *)0x0;
  local_258 = (undefined1  [8])local_330;
  local_288 = (undefined1  [8])
              ((((double)local_1d8._0_8_ + (1.0 - (double)local_2a8._0_8_)) * 0.5) /
              (1.0 - (double)local_2a8._0_8_));
  uVar22 = local_1d8._8_4_;
  if ((int)local_1d8._8_4_ < (int)local_2a8._8_4_) {
    uVar22 = local_2a8._8_4_;
  }
  local_280 = (double)((ulong)local_280 & 0xffffffff00000000);
  pdStack_278 = (double *)0x0;
  local_2d8 = (Fad<double> *)local_2a8;
  local_250._0_8_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_2f0;
  local_1f0._0_8_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_1d8;
  if ((int)uVar22 < 1) {
    local_270 = (Fad<double> *)0x0;
    local_2f8 = (Fad<double> *)local_2a8;
  }
  else {
    local_280 = (double)CONCAT44(SUB84(dVar11,4),uVar22);
    local_2f8 = (Fad<double> *)local_2a8;
    pdStack_278 = (double *)operator_new__((ulong)uVar22 * 8);
    local_270 = (Fad<double> *)0x0;
    if (0 < (int)uVar22) {
      uVar23 = 0;
      do {
        vVar3 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                      *)local_258,(int)uVar23);
        pdStack_278[uVar23] = vVar3;
        uVar23 = uVar23 + 1;
      } while (uVar22 != uVar23);
    }
  }
  uVar10 = local_238._8_4_;
  local_50.val_ = (double)local_238._0_8_;
  local_50.dx_.num_elts = local_238._8_4_;
  local_50.dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)local_238._8_4_ != 0) {
    uVar23 = 0xffffffffffffffff;
    if (-1 < (int)local_238._8_4_) {
      uVar23 = (long)(int)local_238._8_4_ * 8;
    }
    local_50.dx_.ptr_to_data = (double *)operator_new__(uVar23);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_50.dx_.ptr_to_data,(EVP_PKEY_CTX *)local_238._16_8_,
               (EVP_PKEY_CTX *)(ulong)(uint)uVar10);
  }
  local_50.defaultVal = local_220;
  local_268 = ABS(local_50.val_);
  uStack_260 = 0;
  Fad<double>::~Fad(&local_50);
  if (local_268 < 1e-12) {
    local_198.val_ = 0.5;
    if (local_198.dx_.num_elts != 0) {
      local_330 = (undefined1  [8])0x0;
      Vector<double>::operator=(&local_198.dx_,(double *)local_330);
    }
    local_218 = (undefined1  [8])0x3fe0000000000000;
    if (local_210._0_4_ != 0) {
      local_330 = (undefined1  [8])0x0;
      Vector<double>::operator=((Vector<double> *)&local_210,(double *)local_330);
    }
  }
  uVar10 = local_1d8._8_4_;
  local_70.val_ = (double)local_1d8._0_8_;
  local_70.dx_.num_elts = local_1d8._8_4_;
  local_70.dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)local_1d8._8_4_ != 0) {
    uVar23 = 0xffffffffffffffff;
    if (-1 < (int)local_1d8._8_4_) {
      uVar23 = (long)(int)local_1d8._8_4_ * 8;
    }
    local_70.dx_.ptr_to_data = (double *)operator_new__(uVar23);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_70.dx_.ptr_to_data,(EVP_PKEY_CTX *)local_1d8._16_8_,
               (EVP_PKEY_CTX *)(ulong)(uint)uVar10);
  }
  local_70.defaultVal = local_1c0;
  local_268 = ABS(local_70.val_);
  uStack_260 = 0;
  Fad<double>::~Fad(&local_70);
  if (local_268 < 1e-12) {
    local_1b8 = (undefined1  [8])0x3fe0000000000000;
    if (local_1b0._0_4_ != 0) {
      local_330 = (undefined1  [8])0x0;
      Vector<double>::operator=((Vector<double> *)&local_1b0,(double *)local_330);
    }
    local_288 = (undefined1  [8])0x3fe0000000000000;
    if (local_280._0_4_ != 0) {
      local_330 = (undefined1  [8])0x0;
      Vector<double>::operator=((Vector<double> *)&local_280,(double *)local_330);
    }
  }
  uVar10 = local_2a8._8_4_;
  pFVar8 = local_328;
  local_330 = (undefined1  [8])(1.0 - (double)local_2a8._0_8_);
  lVar19 = (long)(int)local_2a8._8_4_;
  local_328 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
              ((ulong)local_328 & 0xffffffff00000000);
  pEStack_320 = (EVP_PKEY_CTX *)0x0;
  if (0 < lVar19) {
    local_328 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
                CONCAT44(SUB84(pFVar8,4),local_2a8._8_4_);
    pEStack_320 = (EVP_PKEY_CTX *)operator_new__(lVar19 * 8);
  }
  local_318 = (Fad<double> *)0x0;
  if (0 < (int)uVar10) {
    lVar15 = 0;
    do {
      *(ulong *)(pEStack_320 + lVar15 * 8) =
           *(ulong *)(local_2a8._16_8_ + lVar15 * 8) ^ 0x8000000000000000;
      lVar15 = lVar15 + 1;
    } while (lVar19 != lVar15);
  }
  local_2e8 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_1b8;
  local_308 = (Fad<double> *)local_330;
  local_310 = (undefined1  [8])local_2f0;
  local_2f0 = (undefined1  [8])&local_198;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (phi->fElem,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)local_310);
  local_2f0 = (undefined1  [8])local_218;
  local_2e8 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_1b8;
  local_308 = (Fad<double> *)local_330;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_310 = (undefined1  [8])local_2f0;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_310 = (undefined1  [8])local_2f0;
  Fad<double>::operator=
            (phi->fElem + 1,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)local_310);
  local_2f0 = (undefined1  [8])local_218;
  local_2e8 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_288;
  local_308 = (Fad<double> *)local_330;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_310 = (undefined1  [8])local_2f0;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_310 = (undefined1  [8])local_2f0;
  Fad<double>::operator=
            (phi->fElem + 2,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)local_310);
  local_2e8 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_288;
  local_308 = (Fad<double> *)local_330;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_310 = (undefined1  [8])local_2f0;
    local_2f0 = (undefined1  [8])&local_198;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_310 = (undefined1  [8])local_2f0;
  local_2f0 = (undefined1  [8])&local_198;
  Fad<double>::operator=
            (phi->fElem + 3,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)local_310);
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 5) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar1 = phi->fElem;
  pFVar1[4].val_ = (double)local_2a8._0_8_;
  Vector<double>::operator=(&pFVar1[4].dx_,(Vector<double> *)(local_2a8 + 8));
  uVar13 = local_238._8_4_;
  uVar10 = local_2a8._8_4_;
  pFVar9 = local_308;
  pFVar1[4].defaultVal = local_290;
  local_310 = (undefined1  [8])((1.0 - (double)local_238._0_8_) - (double)local_2a8._0_8_);
  uVar22 = local_2a8._8_4_;
  if ((int)local_2a8._8_4_ < (int)local_238._8_4_) {
    uVar22 = local_238._8_4_;
  }
  local_308 = (Fad<double> *)((ulong)local_308 & 0xffffffff00000000);
  pEStack_300 = (EVP_PKEY_CTX *)0x0;
  uVar23 = (ulong)uVar22;
  local_268 = (double)CONCAT44(local_268._4_4_,uVar22);
  if (0 < (int)uVar22) {
    local_308 = (Fad<double> *)CONCAT44(SUB84(pFVar9,4),uVar22);
    pEStack_300 = (EVP_PKEY_CTX *)operator_new__(uVar23 * 8);
    uVar22 = local_268._0_4_;
  }
  uVar14 = local_1d8._8_4_;
  pFVar8 = local_2e8;
  local_2f8 = (Fad<double> *)0x0;
  if (0 < (int)uVar22) {
    lVar19 = 0;
    uVar16 = uVar23;
    do {
      pMVar18 = (MEM_CPY<double> *)(local_238._16_8_ + lVar19);
      if (uVar13 == 0) {
        pMVar18 = (MEM_CPY<double> *)&local_220;
      }
      pMVar21 = (MEM_CPY<double> *)(local_2a8._16_8_ + lVar19);
      if (uVar10 == 0) {
        pMVar21 = (MEM_CPY<double> *)&local_290;
      }
      *(double *)(pEStack_300 + lVar19) = -*(double *)pMVar18 - *(double *)pMVar21;
      lVar19 = lVar19 + 8;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  local_2f0 = (undefined1  [8])((1.0 - (double)local_1d8._0_8_) - (double)local_2a8._0_8_);
  local_2cc = uVar10;
  if ((int)uVar10 < (int)local_1d8._8_4_) {
    local_2cc = local_1d8._8_4_;
  }
  uVar16 = (ulong)local_2cc;
  local_2e8 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
              ((ulong)local_2e8 & 0xffffffff00000000);
  pEStack_2e0 = (EVP_PKEY_CTX *)0x0;
  if (0 < (int)local_2cc) {
    local_2e8 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
                CONCAT44(SUB84(pFVar8,4),local_2cc);
    pEStack_2e0 = (EVP_PKEY_CTX *)operator_new__(uVar16 * 8);
    uVar22 = local_268._0_4_;
  }
  uVar12 = local_250._0_8_;
  local_2d8 = (Fad<double> *)0x0;
  if (0 < (int)local_2cc) {
    lVar19 = 0;
    uVar17 = uVar16;
    do {
      pMVar18 = (MEM_CPY<double> *)(local_1d8._16_8_ + lVar19);
      if (uVar14 == 0) {
        pMVar18 = (MEM_CPY<double> *)&local_1c0;
      }
      pMVar21 = (MEM_CPY<double> *)(local_2a8._16_8_ + lVar19);
      if (uVar10 == 0) {
        pMVar21 = (MEM_CPY<double> *)&local_290;
      }
      *(double *)(pEStack_2e0 + lVar19) = -*(double *)pMVar18 - *(double *)pMVar21;
      lVar19 = lVar19 + 8;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  local_258 = (undefined1  [8])(((double)local_238._0_8_ + 1.0) - (double)local_2a8._0_8_);
  local_250._0_8_ = local_250._0_8_ & 0xffffffff00000000;
  local_250.ptr_to_data = (double *)0x0;
  if (0 < (int)uVar22) {
    local_250._4_4_ = SUB84(uVar12,4);
    local_250.num_elts = uVar22;
    local_250.ptr_to_data = (double *)operator_new__(uVar23 * 8);
    uVar22 = local_268._0_4_;
  }
  uVar12 = local_1f0._0_8_;
  local_240 = 0.0;
  if (0 < (int)uVar22) {
    lVar19 = 0;
    do {
      pMVar18 = (MEM_CPY<double> *)(local_238._16_8_ + lVar19);
      if (uVar13 == 0) {
        pMVar18 = (MEM_CPY<double> *)&local_220;
      }
      pMVar21 = (MEM_CPY<double> *)(local_2a8._16_8_ + lVar19);
      if (uVar10 == 0) {
        pMVar21 = (MEM_CPY<double> *)&local_290;
      }
      *(double *)((long)local_250.ptr_to_data + lVar19) = *(double *)pMVar18 - *(double *)pMVar21;
      lVar19 = lVar19 + 8;
      uVar23 = uVar23 - 1;
    } while (uVar23 != 0);
  }
  local_1f8 = (undefined1  [8])(((double)local_1d8._0_8_ + 1.0) - (double)local_2a8._0_8_);
  local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffff00000000;
  local_1f0.ptr_to_data = (double *)0x0;
  if (0 < (int)local_2cc) {
    local_1f0._4_4_ = SUB84(uVar12,4);
    local_1f0.num_elts = local_2cc;
    local_1f0.ptr_to_data = (double *)operator_new__(uVar16 * 8);
  }
  pFVar8 = local_328;
  local_1e0 = 0.0;
  if (0 < (int)local_2cc) {
    lVar19 = 0;
    do {
      pMVar18 = (MEM_CPY<double> *)(local_1d8._16_8_ + lVar19);
      if (uVar14 == 0) {
        pMVar18 = (MEM_CPY<double> *)&local_1c0;
      }
      pMVar21 = (MEM_CPY<double> *)(local_2a8._16_8_ + lVar19);
      if (uVar10 == 0) {
        pMVar21 = (MEM_CPY<double> *)&local_290;
      }
      *(double *)((long)local_1f0.ptr_to_data + lVar19) = *(double *)pMVar18 - *(double *)pMVar21;
      lVar19 = lVar19 + 8;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  local_d0.val_ = (double)local_330;
  local_d0.dx_.num_elts = (int)local_328;
  local_d0.dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)local_328 != 0) {
    uVar23 = 0xffffffffffffffff;
    if (-1 < (int)local_328) {
      uVar23 = (long)(int)local_328 * 8;
    }
    local_d0.dx_.ptr_to_data = (double *)operator_new__(uVar23);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_d0.dx_.ptr_to_data,pEStack_320,
               (EVP_PKEY_CTX *)((ulong)pFVar8 & 0xffffffff));
  }
  pFVar1 = local_308;
  local_d0.defaultVal = (double)local_318;
  local_268 = ABS(local_d0.val_);
  uStack_260 = 0;
  if (1e-12 <= local_268) {
LAB_00de8b6e:
    bVar7 = false;
LAB_00de8b70:
    bVar6 = false;
  }
  else {
    local_f0.val_ = (double)local_310;
    local_f0.dx_.num_elts = (int)local_308;
    local_f0.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_308 != 0) {
      uVar23 = 0xffffffffffffffff;
      if (-1 < (int)local_308) {
        uVar23 = (long)(int)local_308 * 8;
      }
      local_f0.dx_.ptr_to_data = (double *)operator_new__(uVar23);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_f0.dx_.ptr_to_data,pEStack_300,
                 (EVP_PKEY_CTX *)((ulong)pFVar1 & 0xffffffff));
    }
    pFVar8 = local_2e8;
    local_f0.defaultVal = (double)local_2f8;
    if (ABS(local_f0.val_) < 1e-12) goto LAB_00de8b6e;
    local_110.val_ = (double)local_2f0;
    local_110.dx_.num_elts = (int)local_2e8;
    local_110.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_2e8 != 0) {
      uVar23 = 0xffffffffffffffff;
      if (-1 < (int)local_2e8) {
        uVar23 = (long)(int)local_2e8 * 8;
      }
      local_110.dx_.ptr_to_data = (double *)operator_new__(uVar23);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_110.dx_.ptr_to_data,pEStack_2e0,
                 (EVP_PKEY_CTX *)((ulong)pFVar8 & 0xffffffff));
    }
    uVar12 = local_250._0_8_;
    local_110.defaultVal = (double)local_2d8;
    if (ABS(local_110.val_) < 1e-12) {
      bVar7 = true;
      goto LAB_00de8b70;
    }
    local_130.val_ = (double)local_258;
    local_130.dx_.num_elts = local_250.num_elts;
    local_130.dx_.ptr_to_data = (double *)0x0;
    if ((long)local_250.num_elts != 0) {
      uVar23 = 0xffffffffffffffff;
      if (-1 < local_250.num_elts) {
        uVar23 = (long)local_250.num_elts * 8;
      }
      local_130.dx_.ptr_to_data = (double *)operator_new__(uVar23);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_130.dx_.ptr_to_data,(EVP_PKEY_CTX *)local_250.ptr_to_data,
                 (EVP_PKEY_CTX *)(uVar12 & 0xffffffff));
    }
    uVar12 = local_1f0._0_8_;
    local_130.defaultVal = local_240;
    if (1e-12 <= ABS(local_130.val_)) {
      local_b0.val_ = (double)local_1f8;
      local_b0.dx_.num_elts = local_1f0.num_elts;
      local_b0.dx_.ptr_to_data = (double *)0x0;
      if ((long)local_1f0.num_elts != 0) {
        uVar23 = 0xffffffffffffffff;
        if (-1 < local_1f0.num_elts) {
          uVar23 = (long)local_1f0.num_elts * 8;
        }
        local_b0.dx_.ptr_to_data = (double *)operator_new__(uVar23);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_b0.dx_.ptr_to_data,(EVP_PKEY_CTX *)local_1f0.ptr_to_data
                   ,(EVP_PKEY_CTX *)(uVar12 & 0xffffffff));
      }
      local_b0.defaultVal = local_1e0;
      bVar4 = 1e-12 <= ABS(local_b0.val_);
      bVar7 = true;
      bVar6 = true;
      bVar5 = true;
      goto LAB_00de8b77;
    }
    bVar7 = true;
    bVar6 = true;
  }
  bVar5 = false;
  bVar4 = false;
LAB_00de8b77:
  if (bVar5) {
    Fad<double>::~Fad(&local_b0);
  }
  if (bVar6) {
    Fad<double>::~Fad(&local_130);
  }
  if (bVar7) {
    Fad<double>::~Fad(&local_110);
  }
  if (local_268 < 1e-12) {
    Fad<double>::~Fad(&local_f0);
  }
  Fad<double>::~Fad(&local_d0);
  pTVar20 = local_138;
  pFVar8 = local_328;
  if (bVar4) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpyramid.cpp"
               ,0x13c);
  }
  local_90.val_ = (double)local_330;
  local_90.dx_.num_elts = (int)local_328;
  local_90.dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)local_328 != 0) {
    uVar23 = 0xffffffffffffffff;
    if (-1 < (int)local_328) {
      uVar23 = (long)(int)local_328 * 8;
    }
    local_90.dx_.ptr_to_data = (double *)operator_new__(uVar23);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_90.dx_.ptr_to_data,pEStack_320,
               (EVP_PKEY_CTX *)((ulong)pFVar8 & 0xffffffff));
  }
  local_90.defaultVal = (double)local_318;
  local_268 = ABS(local_90.val_);
  uStack_260 = 0;
  Fad<double>::~Fad(&local_90);
  if (local_268 < 1e-12) {
    local_310 = (undefined1  [8])0x3feff7ced916872b;
    if ((int)local_308 != 0) {
      local_2c8._0_8_ = 0;
      Vector<double>::operator=((Vector<double> *)&local_308,(double *)&local_2c8);
    }
    local_2f0 = (undefined1  [8])0x3feff7ced916872b;
    if ((int)local_2e8 != 0) {
      local_2c8._0_8_ = 0;
      Vector<double>::operator=((Vector<double> *)&local_2e8,(double *)&local_2c8);
    }
    local_258 = (undefined1  [8])0x3feff7ced916872b;
    if (local_250.num_elts != 0) {
      local_2c8._0_8_ = 0;
      Vector<double>::operator=(&local_250,(double *)&local_2c8);
    }
    pTVar20 = local_138;
    local_1f8 = (undefined1  [8])0x3feff7ced916872b;
    if (local_1f0.num_elts != 0) {
      local_2c8._0_8_ = 0;
      Vector<double>::operator=(&local_1f0,(double *)&local_2c8);
    }
    local_330 = (undefined1  [8])0x3f50624dd2f1a9fc;
    if ((int)local_328 != 0) {
      local_2c8._0_8_ = 0;
      Vector<double>::operator=((Vector<double> *)&local_328,(double *)&local_2c8);
    }
  }
  local_2c8.fadexpr_.left_.constant_ = -0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  local_340.fadexpr_.left_ = &local_2c8;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_2f0;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=(pTVar20->fElem,&local_340);
  local_2c8.fadexpr_.left_.constant_ = -0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_310;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_340.fadexpr_.left_ = &local_2c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  Fad<double>::operator=(pTVar20->fElem + 1,&local_340);
  local_178 = (undefined8 *)local_310;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  local_2c8.fadexpr_.left_.constant_ = -0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_148;
  local_170 = (Fad<double> *)local_2f0;
  local_168 = &local_178;
  local_160 = local_340.fadexpr_.right_;
  local_158 = (Fad<double> *)local_2f0;
  local_150 = local_178;
  local_148._0_8_ = &local_158;
  local_148._8_8_ = &local_168;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_340.fadexpr_.left_ = &local_2c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  Fad<double>::operator=
            (pTVar20->fElem + 2,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)&local_340);
  local_2c8.fadexpr_.left_.constant_ = 0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_2f0;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    local_340.fadexpr_.left_ = &local_2c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  Fad<double>::operator=
            (pTVar20->fElem + (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow,
             &local_340);
  local_2c8.fadexpr_.left_.constant_ = -0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_258;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    local_340.fadexpr_.left_ = &local_2c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  Fad<double>::operator=
            (pTVar20->fElem + (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow + 1,
             &local_340);
  local_170 = (Fad<double> *)local_2f0;
  local_178 = (undefined8 *)local_258;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  local_2c8.fadexpr_.left_.constant_ = -0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_160 = local_340.fadexpr_.right_;
  local_158 = local_170;
  local_150 = local_178;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    local_340.fadexpr_.left_ = &local_2c8;
    local_2c8.fadexpr_.right_ = (Fad<double> *)local_148;
    local_168 = &local_178;
    local_148._0_8_ = &local_158;
    local_148._8_8_ = &local_168;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_148;
  local_168 = &local_178;
  local_148._0_8_ = &local_158;
  local_148._8_8_ = &local_168;
  Fad<double>::operator=
            (pTVar20->fElem + (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow + 2,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)&local_340);
  local_2c8.fadexpr_.left_.constant_ = 0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_1f8;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    local_340.fadexpr_.left_ = &local_2c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  Fad<double>::operator=
            (pTVar20->fElem + (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 2,
             &local_340);
  local_2c8.fadexpr_.left_.constant_ = 0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_258;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    local_340.fadexpr_.left_ = &local_2c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  Fad<double>::operator=
            (pTVar20->fElem +
             (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 2 + 1,&local_340);
  local_170 = (Fad<double> *)local_1f8;
  local_178 = (undefined8 *)local_258;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  local_2c8.fadexpr_.left_.constant_ = -0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_160 = local_340.fadexpr_.right_;
  local_158 = local_170;
  local_150 = local_178;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    local_340.fadexpr_.left_ = &local_2c8;
    local_2c8.fadexpr_.right_ = (Fad<double> *)local_148;
    local_168 = &local_178;
    local_148._0_8_ = &local_158;
    local_148._8_8_ = &local_168;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_148;
  local_168 = &local_178;
  local_148._0_8_ = &local_158;
  local_148._8_8_ = &local_168;
  Fad<double>::operator=
            (pTVar20->fElem +
             (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 2 + 2,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)&local_340);
  local_2c8.fadexpr_.left_.constant_ = -0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_1f8;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
    local_340.fadexpr_.left_ = &local_2c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  Fad<double>::operator=
            (pTVar20->fElem + (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 3,
             &local_340);
  local_2c8.fadexpr_.left_.constant_ = 0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_310;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
    local_340.fadexpr_.left_ = &local_2c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  Fad<double>::operator=
            (pTVar20->fElem +
             (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 3 + 1,&local_340);
  local_170 = (Fad<double> *)local_1f8;
  local_178 = (undefined8 *)local_310;
  local_340.fadexpr_.right_ = (Fad<double> *)local_330;
  local_2c8.fadexpr_.left_.constant_ = -0.25;
  local_2c8.fadexpr_.left_.defaultVal = 0.0;
  local_160 = local_340.fadexpr_.right_;
  local_158 = local_170;
  local_150 = local_178;
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
    local_340.fadexpr_.left_ = &local_2c8;
    local_2c8.fadexpr_.right_ = (Fad<double> *)local_148;
    local_168 = &local_178;
    local_148._0_8_ = &local_158;
    local_148._8_8_ = &local_168;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_340.fadexpr_.left_ = &local_2c8;
  local_2c8.fadexpr_.right_ = (Fad<double> *)local_148;
  local_168 = &local_178;
  local_148._0_8_ = &local_158;
  local_148._8_8_ = &local_168;
  Fad<double>::operator=
            (pTVar20->fElem +
             (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 3 + 2,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)&local_340);
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar19 = (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  pFVar1 = pTVar20->fElem;
  pFVar1[lVar19 * 4].val_ = 0.0;
  if (pFVar1[lVar19 * 4].dx_.num_elts != 0) {
    local_2c8._0_8_ = 0;
    Vector<double>::operator=(&pFVar1[lVar19 * 4].dx_,(double *)&local_2c8);
  }
  if (((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar19 = (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  pFVar1 = pTVar20->fElem;
  pFVar1[lVar19 * 4 + 1].val_ = 0.0;
  if (pFVar1[lVar19 * 4 + 1].dx_.num_elts != 0) {
    local_2c8._0_8_ = 0;
    Vector<double>::operator=(&pFVar1[lVar19 * 4 + 1].dx_,(double *)&local_2c8);
  }
  if ((2 < (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
     (4 < (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
    lVar19 = (pTVar20->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar1 = pTVar20->fElem;
    pFVar1[lVar19 * 4 + 2].val_ = 1.0;
    if (pFVar1[lVar19 * 4 + 2].dx_.num_elts != 0) {
      local_2c8._0_8_ = 0;
      Vector<double>::operator=(&pFVar1[lVar19 * 4 + 2].dx_,(double *)&local_2c8);
    }
    Fad<double>::~Fad((Fad<double> *)local_1f8);
    Fad<double>::~Fad((Fad<double> *)local_258);
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    Fad<double>::~Fad((Fad<double> *)local_310);
    Fad<double>::~Fad((Fad<double> *)local_330);
    Fad<double>::~Fad((Fad<double> *)local_288);
    Fad<double>::~Fad((Fad<double> *)local_218);
    Fad<double>::~Fad((Fad<double> *)local_1b8);
    Fad<double>::~Fad(&local_198);
    Fad<double>::~Fad((Fad<double> *)local_2a8);
    Fad<double>::~Fad((Fad<double> *)local_1d8);
    Fad<double>::~Fad((Fad<double> *)local_238);
    return;
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

inline void TPZPyramid::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T xi = loc[0], eta = loc[1] , zeta  = loc[2];

        if (zeta> 1.) {
            DebugStop();
        }

        T T0xz = .5*(1.-zeta-xi) / (1.-zeta);
        T T0yz = .5*(1.-zeta-eta) / (1.-zeta);
        T T1xz = .5*(1.-zeta+xi) / (1.-zeta);
        T T1yz = .5*(1.-zeta+eta) / (1.-zeta);
        if (IsZero(xi)) {
            T0xz = 0.5;
            T1xz = 0.5;
        }
        if (IsZero(eta)) {
            T0yz = 0.5;
            T1yz = 0.5;
        }
        T lmez = (1.-zeta);

        phi(0,0)  = T0xz*T0yz*lmez;
        phi(1,0)  = T1xz*T0yz*lmez;
        phi(2,0)  = T1xz*T1yz*lmez;
        phi(3,0)  = T0xz*T1yz*lmez;
        phi(4,0)  = zeta;

        T lmexmez = 1.-xi-zeta;
        T lmeymez = 1.-eta-zeta;
        T lmaxmez = 1.+xi-zeta;
        T lmaymez = 1.+eta-zeta;

        if (IsZero(lmez) && !IsZero(lmexmez) && !IsZero(lmeymez) &&
            !IsZero(lmaxmez) && !IsZero(lmaymez)) {
            DebugStop();
        }
        if (IsZero(lmez)) {
            lmexmez = 0.999;
            lmeymez = 0.999;
            lmaxmez = 0.999;
            lmaymez = 0.999;
            lmez = 0.001;
        }

        dphi(0,0) = -.25*lmeymez / lmez;
        dphi(1,0) = -.25*lmexmez / lmez;
        dphi(2,0) = -.25*(lmeymez+lmexmez-lmexmez*lmeymez/lmez) / lmez;
        dphi(0,1) =  .25*lmeymez / lmez;
        dphi(1,1) = -.25*lmaxmez / lmez;
        dphi(2,1) = -.25*(lmeymez+lmaxmez-lmaxmez*lmeymez/lmez) / lmez;
        dphi(0,2) =  .25*lmaymez / lmez;
        dphi(1,2) =  .25*lmaxmez / lmez;
        dphi(2,2) = -.25*(lmaymez+lmaxmez-lmaxmez*lmaymez/lmez) / lmez;
        dphi(0,3) = -.25*lmaymez / lmez;
        dphi(1,3) =  .25*lmexmez / lmez;
        dphi(2,3) = -.25*(lmaymez+lmexmez-lmexmez*lmaymez/lmez) / lmez;
        dphi(0,4) =  0.0;
        dphi(1,4) =  0.0;
        dphi(2,4) =  1.0;

    }